

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_Hatch::Write(ON_Hatch *this,ON_BinaryArchive *ar)

{
  bool bVar1;
  int iVar2;
  uint minor_version_00;
  ON_HatchLoop **ppOVar3;
  ON_OBSOLETE_V5_HatchExtra *pOVar4;
  bool local_49;
  ON_OBSOLETE_V5_HatchExtra *v5_ud;
  ON_2dPoint basepoint;
  int count;
  int i;
  bool rc;
  int minor_version;
  ON_BinaryArchive *ar_local;
  ON_Hatch *this_local;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(ar);
  minor_version_00 = 1;
  if (0x3b < iVar2) {
    minor_version_00 = 2;
  }
  count._3_1_ = ON_BinaryArchive::Write3dmChunkVersion(ar,1,minor_version_00);
  if (count._3_1_) {
    count._3_1_ = ON_BinaryArchive::WritePlane(ar,&this->m_plane);
  }
  if (count._3_1_ != false) {
    count._3_1_ = ON_BinaryArchive::WriteDouble(ar,this->m_pattern_scale);
  }
  if (count._3_1_ != false) {
    count._3_1_ = ON_BinaryArchive::WriteDouble(ar,this->m_pattern_rotation);
  }
  if (count._3_1_ != false) {
    count._3_1_ = ON_BinaryArchive::Write3dmReferencedComponentIndex
                            (ar,HatchPattern,this->m_pattern_index);
  }
  if (count._3_1_ != false) {
    basepoint.y._0_4_ = ON_SimpleArray<ON_HatchLoop_*>::Count(&this->m_loops);
    if (basepoint.y._0_4_ < 0) {
      basepoint.y._0_4_ = 0;
    }
    count._3_1_ = ON_BinaryArchive::WriteInt(ar,basepoint.y._0_4_);
    basepoint.y._4_4_ = 0;
    while( true ) {
      local_49 = false;
      if (basepoint.y._4_4_ < basepoint.y._0_4_) {
        local_49 = count._3_1_;
      }
      if (local_49 == false) break;
      ppOVar3 = ON_SimpleArray<ON_HatchLoop_*>::operator[](&this->m_loops,basepoint.y._4_4_);
      count._3_1_ = ON_HatchLoop::Write(*ppOVar3,ar);
      basepoint.y._4_4_ = basepoint.y._4_4_ + 1;
    }
  }
  _v5_ud = BasePoint2d(this);
  if (minor_version_00 < 2) {
    bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&v5_ud);
    if ((((bVar1) && (bVar1 = ON_2dPoint::IsZero((ON_2dPoint *)&v5_ud), !bVar1)) &&
        (iVar2 = ON_BinaryArchive::Archive3dmVersion(ar), iVar2 == 0x32)) &&
       (pOVar4 = ON_OBSOLETE_V5_HatchExtra::HatchExtension(this),
       pOVar4 != (ON_OBSOLETE_V5_HatchExtra *)0x0)) {
      (pOVar4->m_basepoint).x = (double)v5_ud;
      (pOVar4->m_basepoint).y = basepoint.x;
    }
  }
  else if (count._3_1_ != false) {
    count._3_1_ = ON_BinaryArchive::WritePoint(ar,(ON_2dPoint *)&v5_ud);
  }
  return count._3_1_;
}

Assistant:

bool ON_Hatch::Write( ON_BinaryArchive& ar) const
{
  // Added basepoint to 1.2;
  const int minor_version = (ar.Archive3dmVersion() >= 60) ? 2 : 1;
  bool rc = ar.Write3dmChunkVersion(1,minor_version);
  if (rc) rc = ar.WritePlane( m_plane);
  if (rc) rc = ar.WriteDouble( m_pattern_scale);
  if (rc) rc = ar.WriteDouble( m_pattern_rotation);
  if (rc) rc = ar.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::HatchPattern, m_pattern_index);
  if (rc)
  {
    int i, count = m_loops.Count();
    if( count < 0 )
      count = 0;
    rc = ar.WriteInt( count);
    for( i = 0; i < count && rc; i++)
      rc = m_loops[i]->Write( ar);
  }
  const ON_2dPoint basepoint = BasePoint2d();
  if (minor_version >= 2)
  {
    // m_basepoint = a 2d (x,y) point.
    if (rc) rc = ar.WritePoint(basepoint);
  }
  else if (
    basepoint.IsValid() 
    && false == basepoint.IsZero()
    && 50 == ar.Archive3dmVersion()
    )
  {
    // add temporary V5 user data cache
    ON_OBSOLETE_V5_HatchExtra* v5_ud = ON_OBSOLETE_V5_HatchExtra::HatchExtension(this);
    if( nullptr!= v5_ud)
      v5_ud->m_basepoint = basepoint;
  }
  return rc;
}